

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.cc
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_16_2_0f6288ca __unary_op;
  anon_class_8_1_8d211705 __unary_op_00;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  long lVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> sequence_to_write;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_15;
  vector<double,_std::allocator<double>_> *tmp_5;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> output;
  int output_length;
  ostringstream error_message_14;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  ostringstream error_message_13;
  AperiodicityExtraction aperiodicity_extraction;
  double tmp_4;
  istream *input_stream_1;
  ostringstream error_message_12;
  ifstream ifs_1;
  vector<double,_std::allocator<double>_> waveform;
  double tmp_3;
  istream *input_stream;
  ostringstream error_message_11;
  ifstream ifs;
  vector<double,_std::allocator<double>_> f0;
  double sampling_rate_in_hz;
  ostringstream error_message_10;
  ostringstream error_message_9;
  int num_input_files;
  char *raw_file;
  char *f0_file;
  ostringstream error_message_8;
  ostringstream error_message_7;
  int tmp_2;
  int max_3;
  int min_3;
  ostringstream error_message_6;
  int tmp_1;
  int max_2;
  int min_2;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  double max_1;
  double min_1;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int tmp;
  int max;
  int min;
  int option_char;
  OutputFormats output_format;
  InputFormats input_format;
  double upper_bound;
  double lower_bound;
  double sampling_rate;
  int frame_shift;
  int fft_length;
  Algorithms algorithm;
  option *in_stack_ffffffffffffdb18;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffdb20;
  undefined1 in_stack_ffffffffffffdb27;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffdb28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffdb30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffdb38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdb40;
  undefined8 in_stack_ffffffffffffdb48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffdb50;
  ostream *in_stack_ffffffffffffdb70;
  undefined1 *puVar7;
  char *local_2460;
  undefined4 in_stack_ffffffffffffdbd0;
  _Ios_Openmode in_stack_ffffffffffffdbd4;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdbd8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffdbe0;
  AperiodicityExtraction *in_stack_ffffffffffffdbe8;
  byte local_2362;
  byte local_231a;
  undefined4 in_stack_ffffffffffffdd08;
  byte in_stack_ffffffffffffdd0c;
  undefined1 in_stack_ffffffffffffdd0d;
  byte in_stack_ffffffffffffdd0e;
  undefined1 in_stack_ffffffffffffdd0f;
  string *in_stack_ffffffffffffdd10;
  byte local_22ca;
  byte local_227a;
  bool local_2252;
  bool local_222a;
  byte local_21e2;
  allocator local_21c1;
  string local_21c0 [32];
  ostringstream local_21a0 [376];
  double *local_2028;
  double *local_2018;
  double *local_2010;
  double *local_2008;
  double *local_2000;
  double *local_1ff0;
  double *local_1fe8;
  double *local_1fe0;
  double *local_1fd8;
  double *local_1fc8;
  double *local_1fc0;
  double *local_1fb8;
  double *local_1fb0;
  double local_1fa8;
  double local_1fa0;
  double *local_1f98;
  double *local_1f90;
  double *local_1f88;
  reference local_1f80;
  vector<double,_std::allocator<double>_> *local_1f78;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_1f70;
  undefined1 *local_1f68;
  undefined1 local_1f59;
  string local_1f58 [24];
  int local_1f40;
  allocator local_1f39;
  string local_1f38 [32];
  ostringstream local_1f18 [376];
  undefined1 local_1da0 [31];
  allocator local_1d81;
  string local_1d80 [32];
  ostringstream local_1d60 [400];
  char *local_1bd0;
  allocator local_1bc1;
  string local_1bc0 [32];
  ostringstream local_1ba0 [376];
  char local_1a28 [544];
  double *local_1808;
  double *local_17f8;
  double *local_17f0;
  double *local_17e8;
  double *local_17e0;
  double *local_17d0;
  double *local_17c8;
  double *local_17c0;
  double *local_17b8;
  double local_17b0;
  double *local_17a8;
  double *local_17a0;
  double *local_1798;
  char *local_1788;
  int local_1780;
  allocator local_1779;
  string local_1778 [32];
  ostringstream local_1758 [376];
  char local_15e0 [520];
  vector<double,_std::allocator<double>_> local_13d8;
  double local_13c0;
  allocator local_13b1;
  string local_13b0 [32];
  ostringstream local_1390 [383];
  allocator local_1211;
  string local_1210 [32];
  ostringstream local_11f0 [380];
  int local_1074;
  char *local_1070;
  char *local_1068;
  allocator local_1059;
  string local_1058 [32];
  ostringstream local_1038 [383];
  allocator local_eb9;
  string local_eb8 [32];
  ostringstream local_e98 [383];
  allocator local_d19;
  string local_d18 [32];
  uint local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  allocator local_ce9;
  string local_ce8 [32];
  ostringstream local_cc8 [383];
  allocator local_b49;
  string local_b48 [32];
  int local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  ostringstream local_930 [383];
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [32];
  ostringstream local_768 [383];
  allocator local_5e9;
  string local_5e8 [32];
  undefined8 local_5c8;
  undefined8 local_5c0;
  allocator local_5b1;
  string local_5b0 [32];
  ostringstream local_590 [383];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  ostringstream local_3c8 [383];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  ostringstream local_200 [399];
  allocator local_71;
  string local_70 [32];
  int local_50;
  undefined4 local_4c;
  undefined4 local_48;
  int local_44;
  uint local_40;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 0x100;
  local_1c = 0x50;
  local_28 = 16.0;
  local_30 = 0.001;
  local_38 = 0.999;
  local_3c = 0;
  local_40 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_44 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffdb30._M_current >> 0x20),
                                   (char **)in_stack_ffffffffffffdb28._M_current,
                                   (char *)CONCAT17(in_stack_ffffffffffffdb27,
                                                    in_stack_ffffffffffffdb20),
                                   in_stack_ffffffffffffdb18,(int *)0x10383e), pcVar1 = ya_optarg,
        local_44 != -1) {
    switch(local_44) {
    case 0x48:
      in_stack_ffffffffffffdd10 = (string *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,(char *)in_stack_ffffffffffffdd10,&local_979);
      in_stack_ffffffffffffdd0f =
           sptk::ConvertStringToDouble
                     ((string *)in_stack_ffffffffffffdb28._M_current,
                      (double *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      in_stack_ffffffffffffdd0c = 1;
      if ((bool)in_stack_ffffffffffffdd0f) {
        in_stack_ffffffffffffdd0d = sptk::IsInRange(local_38,0.0,1.0);
        in_stack_ffffffffffffdd0c = in_stack_ffffffffffffdd0d ^ 0xff;
      }
      in_stack_ffffffffffffdd0e = in_stack_ffffffffffffdd0c;
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      if ((in_stack_ffffffffffffdd0c & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af8);
        std::operator<<((ostream *)local_af8,"The argument for the -H option must be in [0.0, 1.0]")
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b18,"ap",&local_b19);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_b18);
        std::allocator<char>::~allocator((allocator<char> *)&local_b19);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af8);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_2b6f::PrintUsage(in_stack_ffffffffffffdb70);
      return 1;
    case 0x4c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b0,pcVar1,&local_7b1);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_22ca = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_30,0.0,1.0);
        local_22ca = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
      if ((local_22ca & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_930);
        std::operator<<((ostream *)local_930,"The argument for the -L option must be in [0.0, 1.0]")
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_950,"ap",&local_951);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_950);
        std::allocator<char>::~allocator((allocator<char> *)&local_951);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_930);
        return local_4;
      }
      break;
    case 0x61:
      local_48 = 0;
      local_4c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_21e2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_50,0,1);
        local_21e2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if ((local_21e2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_200);
        poVar4 = std::operator<<((ostream *)local_200,
                                 "The argument for the -a option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"ap",&local_221);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_200);
        return local_4;
      }
      local_14 = local_50;
      break;
    case 0x68:
      anon_unknown.dwarf_2b6f::PrintUsage(in_stack_ffffffffffffdb70);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,pcVar1,&local_249);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_222a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      if (local_222a) {
        std::__cxx11::ostringstream::ostringstream(local_3c8);
        std::operator<<((ostream *)local_3c8,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e8,"ap",&local_3e9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3c8);
        return local_4;
      }
      break;
    case 0x6f:
      local_cf0 = 0;
      local_cf4 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d18,pcVar1,&local_d19);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_2362 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_cf8,0,3);
        local_2362 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_d18);
      std::allocator<char>::~allocator((allocator<char> *)&local_d19);
      if ((local_2362 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_e98);
        poVar4 = std::operator<<((ostream *)local_e98,
                                 "The argument for the -o option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_eb8,"ap",&local_eb9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_eb8);
        std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e98);
        return local_4;
      }
      local_40 = local_cf8;
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,pcVar1,&local_411);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_2252 = !bVar2 || local_1c < 1;
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      if (local_2252) {
        std::__cxx11::ostringstream::ostringstream(local_590);
        std::operator<<((ostream *)local_590,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b0,"ap",&local_5b1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_5b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_590);
        return local_4;
      }
      break;
    case 0x71:
      local_b20 = 0;
      local_b24 = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b48,pcVar1,&local_b49);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_231a = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_b28,0,2);
        local_231a = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_b48);
      std::allocator<char>::~allocator((allocator<char> *)&local_b49);
      if ((local_231a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_cc8);
        poVar4 = std::operator<<((ostream *)local_cc8,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ce8,"ap",&local_ce9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_ce8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cc8);
        return local_4;
      }
      local_3c = local_b28;
      break;
    case 0x73:
      local_5c0 = 0x4020000000000000;
      local_5c8 = 0x4058800000000000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,pcVar1,&local_5e9);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffdb28._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      local_227a = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_28,8.0,98.0);
        local_227a = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_5e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      if ((local_227a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_768);
        poVar4 = std::operator<<((ostream *)local_768,
                                 "The argument for the -s option must be in a number ");
        poVar4 = std::operator<<(poVar4,"in the interval [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,8.0);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,98.0);
        std::operator<<(poVar4,"]");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_788,"ap",&local_789);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_788);
        std::allocator<char>::~allocator((allocator<char> *)&local_789);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_768);
        return local_4;
      }
    }
  }
  if (local_38 <= local_30) {
    std::__cxx11::ostringstream::ostringstream(local_1038);
    std::operator<<((ostream *)local_1038,"Lower bound must be less than upper one");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1058,"ap",&local_1059);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffdd10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffdd0f,
                        CONCAT16(in_stack_ffffffffffffdd0e,
                                 CONCAT15(in_stack_ffffffffffffdd0d,
                                          CONCAT14(in_stack_ffffffffffffdd0c,
                                                   in_stack_ffffffffffffdd08)))));
    std::__cxx11::string::~string(local_1058);
    std::allocator<char>::~allocator((allocator<char> *)&local_1059);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1038);
    return local_4;
  }
  local_1074 = local_8 - ya_optind;
  if (local_1074 == 2) {
    local_1068 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_1070 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_1074 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_11f0);
      std::operator<<((ostream *)local_11f0,"Just two input files, f0file and infile, are required")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1210,"ap",&local_1211);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffdd10,
                 (ostringstream *)
                 CONCAT17(in_stack_ffffffffffffdd0f,
                          CONCAT16(in_stack_ffffffffffffdd0e,
                                   CONCAT15(in_stack_ffffffffffffdd0d,
                                            CONCAT14(in_stack_ffffffffffffdd0c,
                                                     in_stack_ffffffffffffdd08)))));
      std::__cxx11::string::~string(local_1210);
      std::allocator<char>::~allocator((allocator<char> *)&local_1211);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_11f0);
      return local_4;
    }
    local_1068 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_1070 = (char *)0x0;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1390);
    std::operator<<((ostream *)local_1390,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_13b0,"ap",&local_13b1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffdd10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffdd0f,
                        CONCAT16(in_stack_ffffffffffffdd0e,
                                 CONCAT15(in_stack_ffffffffffffdd0d,
                                          CONCAT14(in_stack_ffffffffffffdd0c,
                                                   in_stack_ffffffffffffdd08)))));
    std::__cxx11::string::~string(local_13b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_13b1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1390);
    return local_4;
  }
  local_13c0 = local_28 * 1000.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x105197);
  std::ifstream::ifstream(local_15e0);
  pcVar1 = local_1068;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_15e0,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) == 0) {
    local_1788 = local_15e0;
    while (bVar2 = sptk::ReadStream<double>
                             (in_stack_ffffffffffffdb28._M_current,
                              (istream *)
                              CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20)), bVar2)
    {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current,
                 in_stack_ffffffffffffdb28._M_current);
    }
    if (local_3c == 0) {
      local_1798 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17a0 = (double *)
                   std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17a8 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17b0 = local_13c0;
      __unary_op_00.sampling_rate_in_hz._7_1_ = in_stack_ffffffffffffdb27;
      __unary_op_00.sampling_rate_in_hz._0_7_ = in_stack_ffffffffffffdb20;
      local_17b8 = (double *)
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
                             (in_stack_ffffffffffffdb38._M_current,in_stack_ffffffffffffdb30,
                              in_stack_ffffffffffffdb28,__unary_op_00);
    }
    else if (local_3c == 1) {
      in_stack_ffffffffffffdbe8 = (AperiodicityExtraction *)&local_13d8;
      local_17c0 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17c8 = (double *)
                   std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17d0 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17e0 = (double *)
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__1>
                             (local_17c0,local_17c8,local_17d0);
    }
    else if (local_3c == 2) {
      in_stack_ffffffffffffdbd8 = &local_13d8;
      local_17e8 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17f0 = (double *)
                   std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      local_17f8 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin
                             ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb18);
      in_stack_ffffffffffffdbe0 =
           std::
           transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__2>
                     (local_17e8,local_17f0,local_17f8);
      local_1808 = in_stack_ffffffffffffdbe0._M_current;
    }
    local_1780 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1758);
    poVar4 = std::operator<<((ostream *)local_1758,"Cannot open file ");
    std::operator<<(poVar4,local_1068);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1778,"ap",&local_1779);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffdd10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffdd0f,
                        CONCAT16(in_stack_ffffffffffffdd0e,
                                 CONCAT15(in_stack_ffffffffffffdd0d,
                                          CONCAT14(in_stack_ffffffffffffdd0c,
                                                   in_stack_ffffffffffffdd08)))));
    std::__cxx11::string::~string(local_1778);
    std::allocator<char>::~allocator((allocator<char> *)&local_1779);
    local_4 = 1;
    local_1780 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1758);
  }
  std::ifstream::~ifstream(local_15e0);
  if (local_1780 != 0) goto LAB_0010615a;
  bVar2 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current
                    );
  if (bVar2) {
    local_4 = 0;
    local_1780 = 1;
    goto LAB_0010615a;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x105634);
  std::ifstream::ifstream(local_1a28);
  pcVar1 = local_1070;
  if (local_1070 == (char *)0x0) {
LAB_0010583b:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_2460 = (char *)&std::cin;
    }
    else {
      local_2460 = local_1a28;
    }
    local_1bd0 = local_2460;
    while (bVar2 = sptk::ReadStream<double>
                             (in_stack_ffffffffffffdb28._M_current,
                              (istream *)
                              CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20)), bVar2)
    {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current,
                 in_stack_ffffffffffffdb28._M_current);
    }
    local_1780 = 0;
  }
  else {
    in_stack_ffffffffffffdbd4 = std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1a28,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_0010583b;
    std::__cxx11::ostringstream::ostringstream(local_1ba0);
    poVar4 = std::operator<<((ostream *)local_1ba0,"Cannot open file ");
    std::operator<<(poVar4,local_1070);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1bc0,"ap",&local_1bc1);
    sptk::PrintErrorMessage
              (in_stack_ffffffffffffdd10,
               (ostringstream *)
               CONCAT17(in_stack_ffffffffffffdd0f,
                        CONCAT16(in_stack_ffffffffffffdd0e,
                                 CONCAT15(in_stack_ffffffffffffdd0d,
                                          CONCAT14(in_stack_ffffffffffffdd0c,
                                                   in_stack_ffffffffffffdd08)))));
    std::__cxx11::string::~string(local_1bc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bc1);
    local_4 = 1;
    local_1780 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1ba0);
  }
  std::ifstream::~ifstream(local_1a28);
  if (local_1780 == 0) {
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_ffffffffffffdb30._M_current);
    if (bVar2) {
      local_4 = 0;
      local_1780 = 1;
    }
    else {
      sptk::AperiodicityExtraction::AperiodicityExtraction
                ((AperiodicityExtraction *)in_stack_ffffffffffffdb50._M_current,
                 (int)((ulong)in_stack_ffffffffffffdb48 >> 0x20),(int)in_stack_ffffffffffffdb48,
                 (double)in_stack_ffffffffffffdb40,
                 (Algorithms)((ulong)in_stack_ffffffffffffdb38._M_current >> 0x20));
      bVar2 = sptk::AperiodicityExtraction::IsValid
                        ((AperiodicityExtraction *)
                         CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
      if (bVar2) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)0x105ad4);
        bVar2 = sptk::AperiodicityExtraction::Run
                          (in_stack_ffffffffffffdbe8,
                           (vector<double,_std::allocator<double>_> *)
                           in_stack_ffffffffffffdbe0._M_current,in_stack_ffffffffffffdbd8,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0));
        if (bVar2) {
          local_1f40 = local_18 / 2 + 1;
          lVar5 = (long)local_1f40;
          puVar7 = &local_1f59;
          std::allocator<double>::allocator((allocator<double> *)0x105c72);
          std::vector<double,_std::allocator<double>_>::vector
                    (in_stack_ffffffffffffdb40,(size_type)in_stack_ffffffffffffdb38._M_current,
                     (allocator_type *)in_stack_ffffffffffffdb30._M_current);
          std::allocator<double>::~allocator((allocator<double> *)0x105c98);
          local_1f68 = local_1da0;
          local_1f70._M_current =
               (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_stack_ffffffffffffdb18);
          local_1f78 = (vector<double,_std::allocator<double>_> *)
                       std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)in_stack_ffffffffffffdb18);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20)
                                    ,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                      *)in_stack_ffffffffffffdb18), bVar2) {
            local_1f80 = __gnu_cxx::
                         __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                         ::operator*(&local_1f70);
            local_1f88 = (double *)
                         std::vector<double,_std::allocator<double>_>::begin
                                   ((vector<double,_std::allocator<double>_> *)
                                    in_stack_ffffffffffffdb18);
            local_1f90 = (double *)
                         std::vector<double,_std::allocator<double>_>::end
                                   ((vector<double,_std::allocator<double>_> *)
                                    in_stack_ffffffffffffdb18);
            local_1f98 = (double *)
                         std::vector<double,_std::allocator<double>_>::begin
                                   ((vector<double,_std::allocator<double>_> *)
                                    in_stack_ffffffffffffdb18);
            local_1fa8 = local_30;
            local_1fa0 = local_38;
            __unary_op.upper_bound._0_7_ = in_stack_ffffffffffffdb20;
            __unary_op.lower_bound = (double)in_stack_ffffffffffffdb18;
            __unary_op.upper_bound._7_1_ = in_stack_ffffffffffffdb27;
            sequence_to_write =
                 std::
                 transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__3>
                           (in_stack_ffffffffffffdb38,in_stack_ffffffffffffdb30._M_current,
                            in_stack_ffffffffffffdb28,__unary_op);
            poVar4 = (ostream *)(ulong)local_40;
            local_1fb0 = sequence_to_write._M_current;
            switch(poVar4) {
            case (ostream *)0x0:
              break;
            case (ostream *)0x1:
              local_1fb8 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_1fc0 = (double *)
                           std::vector<double,_std::allocator<double>_>::end
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_1fc8 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              in_stack_ffffffffffffdb50 =
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__4>
                             (local_1fb8,local_1fc0,local_1fc8);
              local_1fd8 = in_stack_ffffffffffffdb50._M_current;
              break;
            case (ostream *)0x2:
              in_stack_ffffffffffffdb38._M_current = (double *)local_1f58;
              local_1fe0 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_1fe8 = (double *)
                           std::vector<double,_std::allocator<double>_>::end
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_1ff0 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_2000 = (double *)
                           std::
                           transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__5>
                                     (local_1fe0,local_1fe8,local_1ff0);
              break;
            case (ostream *)0x3:
              in_stack_ffffffffffffdb28._M_current = (double *)local_1f58;
              local_2008 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_2010 = (double *)
                           std::vector<double,_std::allocator<double>_>::end
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              local_2018 = (double *)
                           std::vector<double,_std::allocator<double>_>::begin
                                     ((vector<double,_std::allocator<double>_> *)
                                      in_stack_ffffffffffffdb18);
              in_stack_ffffffffffffdb30 =
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__6>
                             (local_2008,local_2010,local_2018);
              local_2028 = in_stack_ffffffffffffdb30._M_current;
            }
            in_stack_ffffffffffffdb27 =
                 sptk::WriteStream<double>
                           ((int)puVar7,(int)((ulong)lVar5 >> 0x20),
                            (vector<double,_std::allocator<double>_> *)sequence_to_write._M_current,
                            poVar4,(int *)in_stack_ffffffffffffdb50._M_current);
            if (!(bool)in_stack_ffffffffffffdb27) {
              std::__cxx11::ostringstream::ostringstream(local_21a0);
              std::operator<<((ostream *)local_21a0,"Failed to write aperiodicity");
              paVar6 = &local_21c1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_21c0,"ap",paVar6);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffdd10,
                         (ostringstream *)
                         CONCAT17(in_stack_ffffffffffffdd0f,
                                  CONCAT16(in_stack_ffffffffffffdd0e,
                                           CONCAT15(in_stack_ffffffffffffdd0d,
                                                    CONCAT14(in_stack_ffffffffffffdd0c,
                                                             in_stack_ffffffffffffdd08)))));
              std::__cxx11::string::~string(local_21c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_21c1);
              local_4 = 1;
              local_1780 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_21a0);
              goto LAB_001060e2;
            }
            __gnu_cxx::
            __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator++(&local_1f70);
          }
          local_4 = 0;
          local_1780 = 1;
LAB_001060e2:
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current
                    );
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1f18);
          std::operator<<((ostream *)local_1f18,"Failed to extract aperiodicity");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f38,"ap",&local_1f39);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffdd10,
                     (ostringstream *)
                     CONCAT17(in_stack_ffffffffffffdd0f,
                              CONCAT16(in_stack_ffffffffffffdd0e,
                                       CONCAT15(in_stack_ffffffffffffdd0d,
                                                CONCAT14(in_stack_ffffffffffffdd0c,
                                                         in_stack_ffffffffffffdd08)))));
          std::__cxx11::string::~string(local_1f38);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f39);
          local_4 = 1;
          local_1780 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1f18);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_ffffffffffffdb30._M_current);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1d60);
        std::operator<<((ostream *)local_1d60,"Failed to initialize AperiodicityExtraction");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d80,"ap",&local_1d81);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdd10,
                   (ostringstream *)
                   CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,
                                              CONCAT14(in_stack_ffffffffffffdd0c,
                                                       in_stack_ffffffffffffdd08)))));
        std::__cxx11::string::~string(local_1d80);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d81);
        local_4 = 1;
        local_1780 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d60);
      }
      sptk::AperiodicityExtraction::~AperiodicityExtraction
                ((AperiodicityExtraction *)
                 CONCAT17(in_stack_ffffffffffffdb27,in_stack_ffffffffffffdb20));
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current);
LAB_0010615a:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb30._M_current);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  sptk::AperiodicityExtraction::Algorithms algorithm(kDefaultAlgorithm);
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "a:l:p:s:L:H:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'a': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::AperiodicityExtraction::Algorithms::kNumAlgorithms) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        algorithm = static_cast<sptk::AperiodicityExtraction::Algorithms>(tmp);
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound) ||
            !sptk::IsInRange(lower_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound) ||
            !sptk::IsInRange(upper_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Lower bound must be less than upper one";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const char* f0_file;
  const char* raw_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    f0_file = argv[argc - 2];
    raw_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    f0_file = argv[argc - 1];
    raw_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, f0file and infile, are required";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    ifs.open(f0_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << f0_file;
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (input_format) {
      case kPitch: {
        std::transform(
            f0.begin(), f0.end(), f0.begin(), [sampling_rate_in_hz](double x) {
              return (0.0 == x) ? kDefaultF0 : sampling_rate_in_hz / x;
            });
        break;
      }
      case kF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [](double x) { return (0.0 == x) ? kDefaultF0 : x; });
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? kDefaultF0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<double> waveform;
  {
    std::ifstream ifs;
    if (NULL != raw_file) {
      ifs.open(raw_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << raw_file;
        sptk::PrintErrorMessage("ap", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  sptk::AperiodicityExtraction aperiodicity_extraction(
      fft_length, frame_shift, sampling_rate_in_hz, algorithm);
  if (!aperiodicity_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AperiodicityExtraction";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  std::vector<std::vector<double> > aperiodicity;
  if (!aperiodicity_extraction.Run(waveform, f0, &aperiodicity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract aperiodicity";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const int output_length(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  for (const std::vector<double>& tmp : aperiodicity) {
    std::transform(tmp.begin(), tmp.end(), output.begin(),
                   [lower_bound, upper_bound](double a) {
                     return std::min(upper_bound, std::max(lower_bound, a));
                   });

    switch (output_format) {
      case kAperiodicity: {
        // nothing to do
        break;
      }
      case kPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return 1.0 - a; });
        break;
      }
      case kAperiodicityOverPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return a / (1.0 - a); });
        break;
      }
      case kPeriodicityOverAperiodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return (1.0 - a) / a; });
        break;
      }
      default: {
        break;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write aperiodicity";
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
  }

  return 0;
}